

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_slb_describe_load_balancer_ud_plistener_attribute.cc
# Opt level: O2

int __thiscall
aliyun::Slb::DescribeLoadBalancerUDPListenerAttribute
          (Slb *this,SlbDescribeLoadBalancerUDPListenerAttributeRequestType *req,
          SlbDescribeLoadBalancerUDPListenerAttributeResponseType *response,SlbErrorInfo *error_info
          )

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  AliRpcRequest *this_00;
  Value *pVVar4;
  char *pcVar5;
  allocator<char> local_461;
  Value val;
  allocator<char> local_443;
  allocator<char> local_442;
  allocator<char> local_441;
  string local_440;
  string str_response;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar5 = "http";
  if (this->use_tls_ != false) {
    pcVar5 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar5,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_461);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar5 = this->proxy_host_, pcVar5 != (char *)0x0)) &&
     (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar5,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeLoadBalancerUDPListenerAttribute",&local_461);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)&local_440);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)&local_440);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)&local_440);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->load_balancer_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"LoadBalancerId",(allocator<char> *)&local_440);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->load_balancer_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->listener_port)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"ListenerPort",(allocator<char> *)&local_440);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->listener_port);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"OwnerAccount",(allocator<char> *)&local_440);
    std::__cxx11::string::string((string *)&local_3c0,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"RegionId",(allocator<char> *)&local_440);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,this->region_id_,&local_461);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (SlbErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_440,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,anon_var_dwarf_169eda + 9,&local_461);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_440,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,anon_var_dwarf_169eda + 9,&local_441);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_440,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,anon_var_dwarf_169eda + 9,&local_442);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_440,pVVar4);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_440,anon_var_dwarf_169eda + 9,&local_443);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
      }
      if (response != (SlbDescribeLoadBalancerUDPListenerAttributeResponseType *)0x0 && iVar2 == 200
         ) {
        bVar1 = Json::Value::isMember(&val,"ListenerPort");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"ListenerPort");
          IVar3 = Json::Value::asInt(pVVar4);
          response->listener_port = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"BackendServerPort");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"BackendServerPort");
          IVar3 = Json::Value::asInt(pVVar4);
          response->backend_server_port = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Status");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Status");
          Json::Value::asString_abi_cxx11_(&local_440,pVVar4);
          std::__cxx11::string::operator=((string *)&response->status,(string *)&local_440);
          std::__cxx11::string::~string((string *)&local_440);
        }
        bVar1 = Json::Value::isMember(&val,"Bandwidth");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Bandwidth");
          IVar3 = Json::Value::asInt(pVVar4);
          response->bandwidth = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"Scheduler");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"Scheduler");
          Json::Value::asString_abi_cxx11_(&local_440,pVVar4);
          std::__cxx11::string::operator=((string *)&response->scheduler,(string *)&local_440);
          std::__cxx11::string::~string((string *)&local_440);
        }
        bVar1 = Json::Value::isMember(&val,"PersistenceTimeout");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"PersistenceTimeout");
          IVar3 = Json::Value::asInt(pVVar4);
          response->persistence_timeout = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"HealthCheck");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HealthCheck");
          Json::Value::asString_abi_cxx11_(&local_440,pVVar4);
          std::__cxx11::string::operator=((string *)&response->health_check,(string *)&local_440);
          std::__cxx11::string::~string((string *)&local_440);
        }
        bVar1 = Json::Value::isMember(&val,"HealthyThreshold");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HealthyThreshold");
          IVar3 = Json::Value::asInt(pVVar4);
          response->healthy_threshold = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"UnhealthyThreshold");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"UnhealthyThreshold");
          IVar3 = Json::Value::asInt(pVVar4);
          response->unhealthy_threshold = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"HealthCheckConnectTimeout");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HealthCheckConnectTimeout");
          IVar3 = Json::Value::asInt(pVVar4);
          response->health_check_connect_timeout = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"HealthCheckConnectPort");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HealthCheckConnectPort");
          IVar3 = Json::Value::asInt(pVVar4);
          response->health_check_connect_port = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"HealthCheckInterval");
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"HealthCheckInterval");
          IVar3 = Json::Value::asInt(pVVar4);
          response->health_check_interval = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"MaxConnLimit");
        iVar2 = 200;
        if (bVar1) {
          pVVar4 = Json::Value::operator[](&val,"MaxConnLimit");
          IVar3 = Json::Value::asInt(pVVar4);
          response->max_conn_limit = IVar3;
        }
      }
      goto LAB_0013f02b;
    }
  }
  iVar2 = -1;
  if (error_info != (SlbErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0013f02b:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Slb::DescribeLoadBalancerUDPListenerAttribute(const SlbDescribeLoadBalancerUDPListenerAttributeRequestType& req,
                      SlbDescribeLoadBalancerUDPListenerAttributeResponseType* response,
                       SlbErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeLoadBalancerUDPListenerAttribute");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.load_balancer_id.empty()) {
    req_rpc->AddRequestQuery("LoadBalancerId", req.load_balancer_id);
  }
  if(!req.listener_port.empty()) {
    req_rpc->AddRequestQuery("ListenerPort", req.listener_port);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}